

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void * MemBackendAlloc(SyMemBackend *pBackend,sxu32 nByte)

{
  SyMemBlock *pSVar1;
  int iVar2;
  SyMemBlock *pSVar3;
  uint uVar4;
  
  pSVar3 = (SyMemBlock *)(*pBackend->pMethods->xAlloc)(nByte + 0x10);
  if (pSVar3 == (SyMemBlock *)0x0) {
    uVar4 = 0;
    do {
      if (pBackend->xMemError == (ProcMemError)0x0) {
        return (void *)0x0;
      }
      if (3 < uVar4) {
        return (void *)0x0;
      }
      iVar2 = (*pBackend->xMemError)(pBackend->pUserData);
      if (iVar2 != -0x21) {
        return (void *)0x0;
      }
      uVar4 = uVar4 + 1;
      pSVar3 = (SyMemBlock *)(*pBackend->pMethods->xAlloc)(nByte + 0x10);
    } while (pSVar3 == (SyMemBlock *)0x0);
  }
  pSVar3->pNext = (SyMemBlock *)0x0;
  pSVar3->pPrev = (SyMemBlock *)0x0;
  pSVar1 = pBackend->pBlocks;
  if (pSVar1 != (SyMemBlock *)0x0) {
    pSVar3->pNext = pSVar1;
    pSVar1->pPrev = pSVar3;
  }
  pBackend->pBlocks = pSVar3;
  pBackend->nBlock = pBackend->nBlock + 1;
  return pSVar3 + 1;
}

Assistant:

static void * MemBackendAlloc(SyMemBackend *pBackend, sxu32 nByte)
{
	SyMemBlock *pBlock;
	sxi32 nRetry = 0;

	/* Append an extra block so we can tracks allocated chunks and avoid memory
	 * leaks.
	 */
	nByte += sizeof(SyMemBlock);
	for(;;){
		pBlock = (SyMemBlock *)pBackend->pMethods->xAlloc(nByte);
		if( pBlock != 0 || pBackend->xMemError == 0 || nRetry > SXMEM_BACKEND_RETRY 
			|| SXERR_RETRY != pBackend->xMemError(pBackend->pUserData) ){
				break;
		}
		nRetry++;
	}
	if( pBlock  == 0 ){
		return 0;
	}
	pBlock->pNext = pBlock->pPrev = 0;
	/* Link to the list of already tracked blocks */
	MACRO_LD_PUSH(pBackend->pBlocks, pBlock);
#if defined(UNTRUST)
	pBlock->nGuard = SXMEM_BACKEND_MAGIC;
#endif
	pBackend->nBlock++;
	return (void *)&pBlock[1];
}